

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O0

int __thiscall QAccessibleTabBar::indexOfChild(QAccessibleTabBar *this,QAccessibleInterface *child)

{
  int iVar1;
  long lVar2;
  QToolButton *pQVar3;
  QTabBarPrivate *pQVar4;
  char *pcVar5;
  QAccessibleTabButton *in_RSI;
  QAccessibleTabButton *__s;
  long in_RDI;
  undefined1 auVar6 [12];
  QAccessibleTabButton *tabButton;
  QAccessibleInterface *parent;
  QTabBar *in_stack_ffffffffffffffc0;
  
  __s = in_RSI;
  lVar2 = (**(code **)(*(long *)in_RSI + 0x18))();
  if (lVar2 != 0) {
    pQVar3 = (QToolButton *)(**(code **)(*(long *)in_RSI + 0x18))();
    tabBar((QAccessibleTabBar *)0x7d4717);
    pQVar4 = QTabBar::d_func((QTabBar *)0x7d471f);
    if (pQVar3 == pQVar4->leftB) {
      tabBar((QAccessibleTabBar *)0x7d473a);
      iVar1 = QTabBar::count(in_stack_ffffffffffffffc0);
      return iVar1;
    }
  }
  lVar2 = (**(code **)(*(long *)in_RSI + 0x18))();
  if (lVar2 != 0) {
    pQVar3 = (QToolButton *)(**(code **)(*(long *)in_RSI + 0x18))();
    tabBar((QAccessibleTabBar *)0x7d4776);
    pQVar4 = QTabBar::d_func((QTabBar *)0x7d477e);
    if (pQVar3 == pQVar4->rightB) {
      tabBar((QAccessibleTabBar *)0x7d4799);
      iVar1 = QTabBar::count((QTabBar *)pQVar3);
      return iVar1 + 1;
    }
  }
  iVar1 = (**(code **)(*(long *)in_RSI + 0x78))();
  if (iVar1 == 0x25) {
    auVar6 = (**(code **)(*(long *)in_RSI + 0x40))();
    if (auVar6._0_8_ == in_RDI) {
      pcVar5 = QAccessibleTabButton::index(in_RSI,(char *)__s,auVar6._8_4_);
      return (int)pcVar5;
    }
  }
  return -1;
}

Assistant:

int QAccessibleTabBar::indexOfChild(const QAccessibleInterface *child) const
{
    if (child->object() && child->object() == tabBar()->d_func()->leftB)
        return tabBar()->count();
    if (child->object() && child->object() == tabBar()->d_func()->rightB)
        return tabBar()->count() + 1;
    if (child->role() == QAccessible::PageTab) {
        QAccessibleInterface *parent = child->parent();
        if (parent == this) {
            const QAccessibleTabButton *tabButton = static_cast<const QAccessibleTabButton *>(child);
            return tabButton->index();
        }
    }
    return -1;
}